

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

void nullcThrowErrorObject(NULLCRef error)

{
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      ExecutorRegVm::Stop(NULLC::executorRegVm,error);
      return;
    }
    if (NULLC::currExec == 1) {
      ExecutorX86::Stop(NULLC::executorX86,error);
      return;
    }
  }
  return;
}

Assistant:

void nullcThrowErrorObject(NULLCRef error)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		executorX86->Stop(error);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		executorRegVm->Stop(error);
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		executorLLVM->Stop(error);
#endif
	}
}